

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatzinc.cpp
# Opt level: O1

VarBranch FlatZinc::ann2ivarsel(Node *ann)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  VarBranch unaff_EBP;
  char *pcVar4;
  char local_19;
  
  if (ann == (Node *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(ann,&AST::Node::typeinfo,&AST::Atom::typeinfo,0);
  }
  if (lVar3 == 0) {
LAB_00118cef:
    bVar1 = true;
  }
  else {
    pcVar4 = (char *)(lVar3 + 8);
    iVar2 = std::__cxx11::string::compare(pcVar4);
    if (iVar2 == 0) {
      unaff_EBP = VAR_INORDER;
    }
    else {
      iVar2 = std::__cxx11::string::compare(pcVar4);
      unaff_EBP = VAR_SIZE_MIN;
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare(pcVar4);
        if (iVar2 == 0) {
          unaff_EBP = VAR_SIZE_MAX;
        }
        else {
          iVar2 = std::__cxx11::string::compare(pcVar4);
          if (iVar2 == 0) {
            unaff_EBP = VAR_MIN_MIN;
          }
          else {
            iVar2 = std::__cxx11::string::compare(pcVar4);
            if (iVar2 == 0) {
              unaff_EBP = VAR_MAX_MIN;
            }
            else {
              iVar2 = std::__cxx11::string::compare(pcVar4);
              if (iVar2 == 0) {
                unaff_EBP = VAR_MAX_MAX;
              }
              else {
                iVar2 = std::__cxx11::string::compare(pcVar4);
                if (iVar2 == 0) {
                  unaff_EBP = VAR_MIN_MAX;
                }
                else {
                  iVar2 = std::__cxx11::string::compare(pcVar4);
                  if (iVar2 == 0) {
                    unaff_EBP = VAR_DEGREE_MAX;
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare(pcVar4);
                    if (iVar2 != 0) {
                      iVar2 = std::__cxx11::string::compare(pcVar4);
                      if (iVar2 == 0) {
                        unaff_EBP = VAR_REGRET_MIN_MAX;
                      }
                      else {
                        iVar2 = std::__cxx11::string::compare(pcVar4);
                        unaff_EBP = VAR_SIZE_MIN;
                        if (iVar2 != 0) goto LAB_00118cef;
                        unaff_EBP = VAR_RANDOM;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar1 = false;
  }
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "% Warning: Unknown or not support variable selection annotation \'",0x41);
    (*ann->_vptr_Node[2])(ann,&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "\'! Ignore variable selection annotation and replace it by \'input_order\'.",0x48);
    local_19 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_19,1);
    unaff_EBP = VAR_INORDER;
  }
  return unaff_EBP;
}

Assistant:

VarBranch ann2ivarsel(AST::Node* ann) {
	if (auto* s = dynamic_cast<AST::Atom*>(ann)) {
		if (s->id == "input_order") {
			return VAR_INORDER;
		}
		if (s->id == "first_fail") {
			return VAR_SIZE_MIN;
		}
		if (s->id == "anti_first_fail") {
			return VAR_SIZE_MAX;
		}
		if (s->id == "smallest") {
			return VAR_MIN_MIN;
		}
		if (s->id == "smallest_largest") {
			return VAR_MAX_MIN;
		}
		if (s->id == "largest") {
			return VAR_MAX_MAX;
		}
		if (s->id == "largest_smallest") {
			return VAR_MIN_MAX;
		}
		if (s->id == "occurrence") {
			return VAR_DEGREE_MAX;
		}
		if (s->id == "most_constrained") {
			return VAR_SIZE_MIN;
		}
		if (s->id == "max_regret") {
			return VAR_REGRET_MIN_MAX;
		}
		if (s->id == "random_order") {
			return VAR_RANDOM;
		}
#ifdef HAS_VAR_IMPACT
		if (s->id == "impact") return VAR_IMPACT;
#endif
	}
	std::cerr << "% Warning: Unknown or not support variable selection annotation '";
	ann->print(std::cerr);
	std::cerr << "'! Ignore variable selection annotation and replace it by 'input_order'." << '\n';
	return VAR_INORDER;
}